

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paex_mono_asio_channel_select.c
# Opt level: O3

int main(void)

{
  FILE *__stream;
  uint errorCode;
  PaDeviceInfo *pPVar1;
  char *pcVar2;
  long lVar3;
  double dVar4;
  PaStream *stream;
  int outputChannelSelectors [1];
  PaStreamParameters outputParameters;
  PaAsioStreamInfo asioOutputInfo;
  paTestData data;
  PaStream *local_398;
  undefined4 local_38c;
  PaStreamParameters local_388;
  undefined8 local_368;
  undefined4 local_360;
  undefined8 local_358;
  undefined8 local_350;
  undefined4 *local_348;
  float local_33c [200];
  undefined4 local_1c;
  
  lVar3 = 0;
  printf("PortAudio Test: output MONO sine wave. SR = %d, BufSize = %d\n",0xac44,0x40);
  do {
    dVar4 = ((double)(int)lVar3 / 200.0) * 3.141592653589793;
    dVar4 = sin(dVar4 + dVar4);
    local_33c[lVar3] = (float)(dVar4 * 0.8);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 200);
  local_1c = 0;
  errorCode = Pa_Initialize();
  if (errorCode == 0) {
    local_388.device = Pa_GetDefaultOutputDevice();
    local_388.channelCount = 1;
    local_388.sampleFormat = 1;
    pPVar1 = Pa_GetDeviceInfo(local_388.device);
    local_388.suggestedLatency = pPVar1->defaultLowOutputLatency;
    local_388.hostApiSpecificStreamInfo = &local_368;
    local_368 = 0x28;
    local_360 = 3;
    local_358 = 1;
    local_350 = 1;
    local_348 = &local_38c;
    local_38c = 1;
    errorCode = Pa_OpenStream(&local_398,(PaStreamParameters *)0x0,&local_388,44100.0,0x40,1,
                              patestCallback,local_33c);
    if ((errorCode == 0) && (errorCode = Pa_StartStream(local_398), errorCode == 0)) {
      printf("Play for %d seconds.\n",10);
      fflush(_stdout);
      Pa_Sleep(10000);
      errorCode = Pa_StopStream(local_398);
      if ((errorCode == 0) && (errorCode = Pa_CloseStream(local_398), errorCode == 0)) {
        Pa_Terminate();
        puts("Test finished.");
        return 0;
      }
    }
  }
  Pa_Terminate();
  fwrite("An error occured while using the portaudio stream\n",0x32,1,_stderr);
  fprintf(_stderr,"Error number: %d\n",(ulong)errorCode);
  __stream = _stderr;
  pcVar2 = Pa_GetErrorText(errorCode);
  fprintf(__stream,"Error message: %s\n",pcVar2);
  return errorCode;
}

Assistant:

int main(void)
{
    PaStreamParameters outputParameters;
    PaAsioStreamInfo asioOutputInfo;
    PaStream *stream;
    PaError err;
    paTestData data;
    int outputChannelSelectors[1];
    int i;
    printf("PortAudio Test: output MONO sine wave. SR = %d, BufSize = %d\n", SAMPLE_RATE, FRAMES_PER_BUFFER);
    /* initialise sinusoidal wavetable */
    for( i=0; i<TABLE_SIZE; i++ )
    {
        data.sine[i] = (float) (AMPLITUDE * sin( ((double)i/(double)TABLE_SIZE) * M_PI * 2. ));
    }
    data.phase = 0;
    
    err = Pa_Initialize();
    if( err != paNoError ) goto error;

    outputParameters.device = OUTPUT_DEVICE;
    outputParameters.channelCount = 1;       /* MONO output */
    outputParameters.sampleFormat = paFloat32; /* 32 bit floating point output */
    outputParameters.suggestedLatency = Pa_GetDeviceInfo( outputParameters.device )->defaultLowOutputLatency;

	/* Use an ASIO specific structure. WARNING - this is not portable. */
    asioOutputInfo.size = sizeof(PaAsioStreamInfo);
    asioOutputInfo.hostApiType = paASIO;
    asioOutputInfo.version = 1;
    asioOutputInfo.flags = paAsioUseChannelSelectors;
    outputChannelSelectors[0] = 1; /* skip channel 0 and use the second (right) ASIO device channel */
    asioOutputInfo.channelSelectors = outputChannelSelectors;
    outputParameters.hostApiSpecificStreamInfo = &asioOutputInfo;

    err = Pa_OpenStream(
              &stream,
              NULL, /* no input */
              &outputParameters,
              SAMPLE_RATE,
              FRAMES_PER_BUFFER,
              paClipOff,      /* we won't output out of range samples so don't bother clipping them */
              patestCallback,
              &data );
    if( err != paNoError ) goto error;

    err = Pa_StartStream( stream );
    if( err != paNoError ) goto error;
    
    printf("Play for %d seconds.\n", NUM_SECONDS ); fflush(stdout);
    Pa_Sleep( NUM_SECONDS * 1000 );

    err = Pa_StopStream( stream );
    if( err != paNoError ) goto error;
    
    err = Pa_CloseStream( stream );
    if( err != paNoError ) goto error;
    
    Pa_Terminate();
    printf("Test finished.\n");
    return err;
error:
    Pa_Terminate();
    fprintf( stderr, "An error occured while using the portaudio stream\n" );
    fprintf( stderr, "Error number: %d\n", err );
    fprintf( stderr, "Error message: %s\n", Pa_GetErrorText( err ) );
    return err;
}